

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O2

void __thiscall
embree::XMLWriter::XMLWriter
          (XMLWriter *this,Ref<embree::SceneGraph::Node> *root,FileName *fileName,bool embedTextures
          ,bool referenceMaterials,bool binaryFormat)

{
  _Rb_tree_header *p_Var1;
  ostream *poVar2;
  int __oflag;
  allocator local_c1;
  string *local_c0;
  Ref<embree::SceneGraph::Node> local_b8;
  FileName binFileName;
  string local_90;
  string local_70 [32];
  string local_50 [32];
  
  std::fstream::fstream(this);
  local_c0 = (string *)&this->bin;
  std::fstream::fstream(local_c0);
  (this->nodeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->nodeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->nodeMap)._M_t._M_impl.super__Rb_tree_header;
  this->ident = 0;
  this->currentNodeID = 0;
  (this->nodeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->nodeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->nodeMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->textureMap)._M_t._M_impl.super__Rb_tree_header;
  (this->textureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->textureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->textureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->textureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->textureMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->embedTextures = embedTextures;
  this->referenceMaterials = referenceMaterials;
  this->binaryFormat = binaryFormat;
  std::ios::exceptions((int)*(undefined8 *)(*(long *)this + -0x18) + (int)this);
  std::__cxx11::string::string((string *)&binFileName,(string *)fileName);
  std::fstream::open((string *)this,(_Ios_Openmode)&binFileName);
  std::__cxx11::string::~string((string *)&binFileName);
  if (binaryFormat) {
    std::__cxx11::string::string((string *)&local_90,".bin",&local_c1);
    FileName::addExt(&binFileName,fileName,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::ios::exceptions((int)*(undefined8 *)(*(long *)local_c0 + -0x18) + (int)local_c0);
    std::__cxx11::string::string((string *)&local_90,(string *)&binFileName);
    std::fstream::open(local_c0,(_Ios_Openmode)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&binFileName);
  }
  poVar2 = std::operator<<((ostream *)&this->field_0x10,"<?xml version=\"1.0\"?>");
  std::endl<char,std::char_traits<char>>(poVar2);
  (*(root->ptr->super_RefCount)._vptr_RefCount[6])();
  std::__cxx11::string::string(local_50,"scene",(allocator *)&binFileName);
  open(this,(char *)local_50,__oflag);
  std::__cxx11::string::~string(local_50);
  local_b8 = (Ref<embree::SceneGraph::Node>)root->ptr;
  if (local_b8.ptr != (Node *)0x0) {
    (*((local_b8.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  store(this,&local_b8);
  if (local_b8.ptr != (Node *)0x0) {
    (*((local_b8.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  std::__cxx11::string::string(local_70,"scene",(allocator *)&binFileName);
  close(this,(int)local_70);
  std::__cxx11::string::~string(local_70);
  (*(root->ptr->super_RefCount)._vptr_RefCount[8])();
  return;
}

Assistant:

XMLWriter::XMLWriter(Ref<SceneGraph::Node> root, const FileName& fileName, bool embedTextures, bool referenceMaterials, bool binaryFormat) 
    : ident(0), currentNodeID(0), embedTextures(embedTextures), referenceMaterials(referenceMaterials), binaryFormat(binaryFormat)
  {
    xml.exceptions (std::fstream::failbit | std::fstream::badbit);
    xml.open (fileName, std::fstream::out);

    if (binaryFormat)
    {
      const FileName binFileName = fileName.addExt(".bin");
      bin.exceptions (std::fstream::failbit | std::fstream::badbit);
      bin.open (binFileName, std::fstream::out | std::fstream::binary);
    }

    xml << "<?xml version=\"1.0\"?>" << std::endl;
    root->calculateInDegree();
    open("scene");
    store(root);
    close("scene");
    root->resetInDegree();
  }